

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O3

void Eigen::internal::triangular_solve_matrix<double,_long,_2,_2,_false,_1,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  long lVar1;
  ResScalar *pRVar2;
  LhsScalar *pLVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  size_t __size;
  double dVar12;
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  long panelLength;
  ulong uVar18;
  double *pdVar19;
  double dVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  double local_178;
  double *local_170;
  double local_168;
  long local_160;
  long local_158;
  double local_150;
  long local_148;
  long local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  long local_120;
  long local_118;
  double *local_110;
  long local_108;
  long local_100;
  long local_f8;
  double *local_f0;
  ulong local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  ulong local_a8;
  long local_a0;
  double *local_98;
  long local_90;
  LhsScalar *local_88;
  double *local_80;
  double *local_78;
  double *local_70;
  long local_68;
  LhsScalar *local_60;
  double *local_58;
  double *local_50;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> local_43;
  gemm_pack_rhs<double,_long,_4,_1,_false,_true> local_42;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_true> local_41;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> pack_rhs;
  gemm_pack_rhs<double,_long,_4,_1,_false,_true> pack_rhs_panel;
  double *pdStack_40;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_true> pack_lhs_panel;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_31 [8];
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  
  pdVar7 = &local_178;
  local_68 = otherStride;
  local_d0 = _other;
  local_148 = blocking->m_mc;
  pdVar8 = (double *)blocking->m_kc;
  local_90 = otherSize;
  if (local_148 < otherSize) {
    local_90 = local_148;
  }
  uVar17 = local_90 * (long)pdVar8;
  if (uVar17 >> 0x3d != 0) {
LAB_0010a2e8:
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = operator_delete;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_60 = blocking->m_blockA;
  pdStack_40 = _tri;
  local_b8 = (double *)size;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar17 < 0x4001) {
      pdVar7 = (double *)((long)&local_178 - (uVar17 * 8 + 0xf & 0xfffffffffffffff0));
      local_88 = pdVar7;
      local_60 = pdVar7;
    }
    else {
      local_60 = (LhsScalar *)malloc(uVar17 * 8);
      local_88 = local_60;
      if (local_60 == (LhsScalar *)0x0) goto LAB_0010a2e8;
    }
  }
  else {
    local_88 = (LhsScalar *)0x0;
    pdVar7 = &local_178;
  }
  local_b0 = pdVar8;
  uVar18 = (long)pdVar8 * (long)local_b8;
  if (0x1fffffffffffffff < uVar18) {
    pdVar7[-1] = 5.38697560023961e-318;
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = operator_delete;
    pdVar7[-1] = 5.38715346387212e-318;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_58 = blocking->m_blockB;
  if (blocking->m_blockB == (double *)0x0) {
    if (uVar18 < 0x4001) {
      pdVar7 = (double *)((long)pdVar7 - (uVar18 * 8 + 0xf & 0xfffffffffffffff0));
      local_80 = pdVar7;
      local_58 = pdVar7;
    }
    else {
      pdVar7[-1] = 5.37855178097802e-318;
      local_58 = (double *)malloc(uVar18 * 8);
      local_80 = local_58;
      if (local_58 == (double *)0x0) {
        pdVar7[-1] = 5.38745484391608e-318;
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = operator_delete;
        pdVar7[-1] = 5.38763270754858e-318;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_80 = (double *)0x0;
  }
  lVar10 = local_90;
  if (((ulong)local_b0 & 0x1c00000000000000) != 0) {
    pdVar7[-1] = 5.3872028704367e-318;
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = operator_delete;
    pdVar7[-1] = 5.3873807340692e-318;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  __size = (long)local_b0 * 0x40;
  local_98 = blocking->m_blockW;
  local_a8 = uVar17;
  local_e8 = uVar18;
  if (blocking->m_blockW == (double *)0x0) {
    if (__size < 0x20001) {
      pdVar7 = pdVar7 + (long)local_b0 * -8;
      bVar23 = false;
      local_78 = pdVar7;
      local_98 = pdVar7;
    }
    else {
      pdVar7[-1] = 5.37938675191949e-318;
      local_78 = (double *)malloc(__size);
      if (local_78 == (double *)0x0) {
        pdVar7[-1] = 5.38768211411317e-318;
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = operator_delete;
        pdVar7[-1] = (double)&LAB_0010a3d3;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      bVar23 = true;
      local_98 = local_78;
    }
  }
  else {
    bVar23 = 0x20000 < __size;
    local_78 = (double *)0x0;
  }
  lVar4 = local_68;
  if (0 < (long)local_b8) {
    local_120 = (triStride * 8 + 8) * (long)local_b0;
    local_118 = (long)local_b0 * local_68 * 8;
    local_140 = lVar10 * 8;
    local_160 = local_68 << 5;
    lVar10 = 0;
    local_c0 = local_d0;
    local_c8 = pdStack_40;
    local_f8 = otherSize;
    pdVar8 = pdStack_40;
    pdVar13 = local_b8;
    do {
      local_128 = pdVar13;
      if ((long)local_b0 < (long)pdVar13) {
        pdVar13 = local_b0;
      }
      local_f0 = pdVar13;
      pdVar19 = (double *)((long)local_b8 - lVar10);
      pdVar13 = pdVar19;
      if ((long)local_b0 < (long)pdVar19) {
        pdVar13 = local_b0;
      }
      pdVar9 = local_58 + (long)pdVar13 * (long)pdVar13;
      dVar20 = (double)((long)pdVar19 - (long)pdVar13);
      local_70 = pdVar13;
      local_a0 = (long)pdVar13 + lVar10;
      if (dVar20 != 0.0 && (long)pdVar13 <= (long)pdVar19) {
        pdVar7[-2] = 0.0;
        pdVar7[-1] = 0.0;
        pdVar7[-3] = 5.38077507638431e-318;
        gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
                  (&local_43,pdVar9,pdVar8 + lVar10 * triStride + (long)pdVar13 + lVar10,triStride,
                   (long)pdVar13,(long)dVar20,(long)pdVar7[-2],(long)pdVar7[-1]);
        pdVar8 = pdStack_40;
      }
      local_138 = pdVar9;
      local_150 = dVar20;
      local_108 = lVar10;
      lVar10 = local_a0;
      pdVar13 = local_70;
      if (0 < (long)local_70) {
        local_50 = (double *)((long)local_f0 << 5);
        lVar21 = 0;
        pdVar19 = local_c8;
        pdVar9 = local_f0;
        pdVar16 = local_58;
        do {
          if (lVar21 != 0) {
            pdVar8 = (double *)0x4;
            if ((long)pdVar9 < 4) {
              pdVar8 = pdVar9;
            }
            pdVar7[-1] = 0.0;
            pdVar7[-2] = (double)pdVar13;
            local_e0 = pdVar19;
            pdVar7[-3] = 5.38142724303682e-318;
            gemm_pack_rhs<double,_long,_4,_1,_false,_true>::operator()
                      (&local_42,pdVar16,pdVar19,triStride,lVar21,(long)pdVar8,(long)pdVar7[-2],
                       (long)pdVar7[-1]);
            pdVar19 = local_e0;
            pdVar8 = pdStack_40;
            lVar10 = local_a0;
            pdVar13 = local_70;
          }
          lVar21 = lVar21 + 4;
          pdVar9 = (double *)((long)pdVar9 + -4);
          pdVar16 = (double *)((long)pdVar16 + (long)local_50);
          pdVar19 = pdVar19 + 4;
        } while (lVar21 < (long)pdVar13);
      }
      if (0 < local_f8) {
        local_130 = local_d0 + lVar10 * local_68;
        local_d8 = local_c0;
        lVar10 = 0;
        lVar21 = local_f8;
        do {
          lVar22 = local_f8;
          if (local_148 < local_f8) {
            lVar22 = local_148;
          }
          local_158 = lVar21;
          if (lVar21 <= lVar22) {
            lVar22 = lVar21;
          }
          local_100 = lVar10;
          lVar21 = local_f8 - lVar10;
          if (local_90 <= local_f8 - lVar10) {
            lVar21 = local_90;
          }
          if (0 < (long)pdVar13) {
            local_110 = local_d0 + lVar10;
            local_50 = local_d8;
            lVar10 = 0;
            pdVar19 = local_f0;
            do {
              lVar5 = local_68;
              local_170 = pdVar19;
              local_e0 = (double *)0x4;
              if ((long)pdVar19 < 4) {
                local_e0 = pdVar19;
              }
              if ((long)local_e0 < 2) {
                local_e0 = (double *)0x1;
              }
              dVar20 = (double)((long)pdVar13 - lVar10);
              dVar12 = 1.97626258336499e-323;
              if ((long)dVar20 < 4) {
                dVar12 = dVar20;
              }
              lVar1 = lVar10 + local_108;
              local_a0 = lVar10;
              local_178 = dVar12;
              if (lVar10 != 0) {
                local_168 = dVar20;
                pRVar2 = local_110 + lVar1 * local_68;
                pdVar8 = local_58 + lVar10 * (long)pdVar13;
                pdVar7[-2] = (double)local_98;
                pdVar7[-4] = 0.0;
                pdVar7[-3] = 0.0;
                pdVar7[-5] = (double)pdVar13;
                pdVar7[-6] = (double)pdVar13;
                pdVar7[-7] = dVar12;
                pdVar7[-8] = (double)lVar10;
                pLVar3 = local_60;
                pdVar7[-9] = 5.38353690334456e-318;
                gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                          (local_31,pRVar2,lVar5,pLVar3,pdVar8,lVar21,(long)pdVar7[-8],
                           (long)pdVar7[-7],-1.0,(long)pdVar7[-6],(long)pdVar7[-5],(long)pdVar7[-4],
                           (long)pdVar7[-3],(double *)pdVar7[-2]);
                dVar20 = local_168;
                pdVar8 = pdStack_40;
                pdVar13 = local_70;
              }
              pLVar3 = local_60;
              lVar5 = local_68;
              lVar10 = local_a0;
              dVar12 = local_178;
              if (0 < (long)dVar20) {
                pdVar9 = (double *)0x0;
                pdVar19 = local_50;
                do {
                  lVar11 = (long)pdVar9 + lVar1;
                  if (pdVar9 != (double *)0x0) {
                    pdVar14 = (double *)0x0;
                    pdVar16 = local_50;
                    do {
                      if (0 < lVar21) {
                        dVar20 = pdVar8[lVar11 + ((long)pdVar14 + lVar1) * triStride];
                        lVar15 = 0;
                        do {
                          pdVar19[lVar15] = pdVar19[lVar15] - pdVar16[lVar15] * dVar20;
                          lVar15 = lVar15 + 1;
                        } while (lVar22 != lVar15);
                      }
                      pdVar14 = (double *)((long)pdVar14 + 1);
                      pdVar16 = pdVar16 + lVar4;
                    } while (pdVar14 != pdVar9);
                  }
                  if (0 < lVar21) {
                    dVar20 = pdVar8[lVar11 * triStride + lVar11];
                    lVar11 = 0;
                    do {
                      pdVar19[lVar11] = pdVar19[lVar11] / dVar20;
                      lVar11 = lVar11 + 1;
                    } while (lVar22 != lVar11);
                  }
                  pdVar9 = (double *)((long)pdVar9 + 1);
                  pdVar19 = pdVar19 + lVar4;
                } while (pdVar9 != local_e0);
              }
              pdVar8 = local_110 + lVar1 * local_68;
              pdVar7[-1] = (double)local_a0;
              pdVar7[-2] = (double)pdVar13;
              pdVar7[-3] = 5.38471277958166e-318;
              gemm_pack_lhs<double,_long,_4,_2,_0,_false,_true>::operator()
                        (&local_41,pLVar3,pdVar8,lVar5,(long)dVar12,lVar21,(long)pdVar7[-2],
                         (long)pdVar7[-1]);
              lVar10 = lVar10 + 4;
              pdVar19 = (double *)((long)local_170 + -4);
              local_50 = (double *)((long)local_50 + local_160);
              pdVar8 = pdStack_40;
              pdVar13 = local_70;
            } while (lVar10 < (long)local_70);
          }
          lVar10 = local_100;
          dVar20 = local_150;
          if (0 < (long)local_150) {
            pRVar2 = local_130 + local_100;
            pdVar7[-2] = (double)local_98;
            pdVar7[-4] = 0.0;
            pdVar7[-3] = 0.0;
            pdVar7[-5] = -NAN;
            pdVar7[-6] = -NAN;
            pdVar7[-7] = dVar20;
            pdVar7[-8] = (double)pdVar13;
            pLVar3 = local_60;
            lVar22 = local_68;
            pdVar8 = local_138;
            pdVar7[-9] = 5.38555763183605e-318;
            gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                      (local_31,pRVar2,lVar22,pLVar3,pdVar8,lVar21,(long)pdVar7[-8],(long)pdVar7[-7]
                       ,-1.0,(long)pdVar7[-6],(long)pdVar7[-5],(long)pdVar7[-4],(long)pdVar7[-3],
                       (double *)pdVar7[-2]);
            pdVar8 = pdStack_40;
            pdVar13 = local_70;
          }
          lVar10 = lVar10 + local_90;
          lVar21 = local_158 - local_90;
          local_d8 = (double *)((long)local_d8 + local_140);
        } while (lVar10 < local_f8);
      }
      lVar10 = local_108 + (long)local_b0;
      pdVar13 = (double *)((long)local_128 - (long)local_b0);
      local_c8 = (double *)((long)local_c8 + local_120);
      local_c0 = (double *)((long)local_c0 + local_118);
    } while (lVar10 < (long)local_b8);
  }
  pdVar8 = local_78;
  if (bVar23) {
    pdVar7[-1] = 5.38639260277752e-318;
    free(pdVar8);
  }
  pdVar8 = local_80;
  uVar17 = local_a8;
  if (0x4000 < local_e8) {
    pdVar7[-1] = 5.38653588181482e-318;
    free(pdVar8);
  }
  pLVar3 = local_88;
  if (0x4000 < uVar17) {
    pdVar7[-1] = 5.38662481363107e-318;
    free(pLVar3);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheRight,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index rows = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> rhs(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> lhs(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      RhsStorageOrder   = TriStorageOrder,
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*size;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar,Scalar, Index, Traits::mr, Traits::nr, false, Conjugate> gebp_kernel;
    gemm_pack_rhs<Scalar, Index, Traits::nr,RhsStorageOrder> pack_rhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr,RhsStorageOrder,false,true> pack_rhs_panel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, ColMajor, false, true> pack_lhs_panel;

    for(Index k2=IsLower ? size : 0;
        IsLower ? k2>0 : k2<size;
        IsLower ? k2-=kc : k2+=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? k2 : size-k2, kc);
      Index actual_k2 = IsLower ? k2-actual_kc : k2 ;

      Index startPanel = IsLower ? 0 : k2+actual_kc;
      Index rs = IsLower ? actual_k2 : size - actual_k2 - actual_kc;
      Scalar* geb = blockB+actual_kc*actual_kc;

      if (rs>0) pack_rhs(geb, &rhs(actual_k2,startPanel), triStride, actual_kc, rs);

      // triangular packing (we only pack the panels off the diagonal,
      // neglecting the blocks overlapping the diagonal
      {
        for (Index j2=0; j2<actual_kc; j2+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-j2, SmallPanelWidth);
          Index actual_j2 = actual_k2 + j2;
          Index panelOffset = IsLower ? j2+actualPanelWidth : 0;
          Index panelLength = IsLower ? actual_kc-j2-actualPanelWidth : j2;

          if (panelLength>0)
          pack_rhs_panel(blockB+j2*actual_kc,
                         &rhs(actual_k2+panelOffset, actual_j2), triStride,
                         panelLength, actualPanelWidth,
                         actual_kc, panelOffset);
        }
      }

      for(Index i2=0; i2<rows; i2+=mc)
      {
        const Index actual_mc = (std::min)(mc,rows-i2);

        // triangular solver kernel
        {
          // for each small block of the diagonal (=> vertical panels of rhs)
          for (Index j2 = IsLower
                      ? (actual_kc - ((actual_kc%SmallPanelWidth) ? Index(actual_kc%SmallPanelWidth)
                                                                  : Index(SmallPanelWidth)))
                      : 0;
               IsLower ? j2>=0 : j2<actual_kc;
               IsLower ? j2-=SmallPanelWidth : j2+=SmallPanelWidth)
          {
            Index actualPanelWidth = std::min<Index>(actual_kc-j2, SmallPanelWidth);
            Index absolute_j2 = actual_k2 + j2;
            Index panelOffset = IsLower ? j2+actualPanelWidth : 0;
            Index panelLength = IsLower ? actual_kc - j2 - actualPanelWidth : j2;

            // GEBP
            if(panelLength>0)
            {
              gebp_kernel(&lhs(i2,absolute_j2), otherStride,
                          blockA, blockB+j2*actual_kc,
                          actual_mc, panelLength, actualPanelWidth,
                          Scalar(-1),
                          actual_kc, actual_kc, // strides
                          panelOffset, panelOffset, // offsets
                          blockW);  // workspace
            }

            // unblocked triangular solve
            for (Index k=0; k<actualPanelWidth; ++k)
            {
              Index j = IsLower ? absolute_j2+actualPanelWidth-k-1 : absolute_j2+k;

              Scalar* r = &lhs(i2,j);
              for (Index k3=0; k3<k; ++k3)
              {
                Scalar b = conj(rhs(IsLower ? j+1+k3 : absolute_j2+k3,j));
                Scalar* a = &lhs(i2,IsLower ? j+1+k3 : absolute_j2+k3);
                for (Index i=0; i<actual_mc; ++i)
                  r[i] -= a[i] * b;
              }
              if((Mode & UnitDiag)==0)
              {
                Scalar b = conj(rhs(j,j));
                for (Index i=0; i<actual_mc; ++i)
                  r[i] /= b;
              }
            }

            // pack the just computed part of lhs to A
            pack_lhs_panel(blockA, _other+absolute_j2*otherStride+i2, otherStride,
                           actualPanelWidth, actual_mc,
                           actual_kc, j2);
          }
        }

        if (rs>0)
          gebp_kernel(_other+i2+startPanel*otherStride, otherStride, blockA, geb,
                      actual_mc, actual_kc, rs, Scalar(-1),
                      -1, -1, 0, 0, blockW);
      }
    }
  }